

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

int __thiscall Parse::paramList(Parse *this)

{
  int iVar1;
  int iVar2;
  DelimiterTable *pDVar3;
  int iVar4;
  int iVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  key_type local_50;
  
  iVar1 = this->curIndex;
  iVar4 = param(this);
  if (iVar4 == 0) {
    this->curIndex = iVar1;
    iVar4 = 0;
  }
  else {
    this->paraNum = this->paraNum + 1;
    iVar4 = 1;
    if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
        super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
      pDVar3 = this->delimiterTable;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,",","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&(pDVar3->
                             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).index,&local_50);
      iVar5 = *pmVar6;
      iVar2 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
              super__Vector_impl_data._M_start[this->curIndex].id;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar5 == iVar2) {
        this->curIndex = this->curIndex + 1;
        iVar5 = paramList(this);
        if (iVar5 == 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_33c52);
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             (poVar7,(this->tokenVec->
                                     super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                     super__Vector_impl_data._M_start[iVar1].line);
          poVar7 = std::operator<<(poVar7,anon_var_dwarf_33c5e);
          std::endl<char,std::char_traits<char>>(poVar7);
          exit(0);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int Parse::paramList() {
    int index = curIndex;
    if(!param()) {
        curIndex = index;
        return 0;
    }
    paraNum++;
    if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[","] == tokenVec[curIndex].id) {
        curIndex++;
        if(!paramList()) {
            cout << "在" << tokenVec[index].line << "行缺少形式参数声明" << endl;
            exit(0);
        }
    }
    return 1;
}